

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_api_v2.c
# Opt level: O1

MPP_RET hal_h265ev2_deinit(void *hal)

{
  void *ptr;
  code *pcVar1;
  MPP_RET MVar2;
  
  ptr = *(void **)((long)hal + 8);
  if ((*hal == 0 || ptr == (void *)0x0) || (pcVar1 = *(code **)(*hal + 0x20), pcVar1 == (code *)0x0)
     ) {
    MVar2 = MPP_OK;
  }
  else {
    MVar2 = (*pcVar1)(ptr);
    mpp_osal_free("hal_h265ev2_deinit",ptr);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_h265ev2_deinit(void *hal)
{
    HalH265eV2Ctx *ctx = (HalH265eV2Ctx *)hal;
    const MppEncHalApi *api = ctx->api;
    void *hw_ctx = ctx->hw_ctx;
    MPP_RET ret = MPP_OK;

    if (!hw_ctx || !api || !api->deinit)
        return MPP_OK;

    ret = api->deinit(hw_ctx);
    MPP_FREE(hw_ctx);
    return ret;
}